

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
* mult_matrix_on_constant<double>
            (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *__return_storage_ptr__,
            vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *a,double *C)

{
  pointer pvVar1;
  pointer pvVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  allocator_type local_4a;
  allocator_type local_49;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  pvVar1 = (a->
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(a->
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1) / 0x18;
  uVar6 = (ulong)((long)*(pointer *)
                         ((long)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>).
                                 _M_impl.super__Vector_impl_data + 8) -
                 *(long *)&(pvVar1->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data) >> 3;
  iVar5 = (int)uVar6;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_48,(long)iVar5,&local_49);
  iVar8 = (int)uVar3;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(__return_storage_ptr__,(long)iVar8,(value_type *)&local_48,&local_4a);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  uVar4 = 0;
  uVar6 = uVar6 & 0xffffffff;
  if (iVar5 < 1) {
    uVar6 = uVar4;
  }
  uVar3 = uVar3 & 0xffffffff;
  if (iVar8 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar4 != uVar3; uVar4 = uVar4 + 1) {
    pvVar1 = (a->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    pvVar2 = (__return_storage_ptr__->
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
      *(double *)
       (*(long *)&pvVar2[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data + uVar7 * 8) =
           *(double *)
            (*(long *)&pvVar1[uVar4].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data + uVar7 * 8) * *C;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::vector<T> > mult_matrix_on_constant(const std::vector<std::vector<T> >& a, const T& C){
    int n = a.size();
    int m = a[0].size();
    std::vector<std::vector<T> > ans(n, std::vector<T>(m));
    for (int i = 0; i < n; ++i)
        for (int j = 0; j < m; ++j)
            ans[i][j] = a[i][j]*C;
    return ans;
}